

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nested.cpp
# Opt level: O0

tuple<NS_*> test_graphs::double_nested(void)

{
  NS *data;
  N *this;
  NS *graph;
  void *pvVar1;
  char *data_00;
  N *this_00;
  N *pNVar2;
  void *pvVar3;
  _Tuple_impl<0UL,_NS_*> in_RDI;
  N *c;
  N *s;
  N *ym;
  N *xm;
  N *y;
  N *x;
  N *b;
  N *a;
  NS *g2b;
  NS *g2a;
  NS *g1b;
  NS *g1a;
  NS *g0;
  N *local_100;
  sockaddr *local_f8;
  undefined8 local_f0;
  N *local_e8;
  sockaddr *local_e0;
  undefined8 local_d8;
  N *local_d0;
  sockaddr *local_c8;
  undefined8 local_c0;
  N *local_b8;
  sockaddr *local_b0;
  undefined8 local_a8;
  N *local_a0;
  sockaddr *local_98;
  undefined8 local_90;
  N *local_88;
  sockaddr *local_80;
  undefined8 local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  N *local_50;
  N *local_48;
  N *local_40;
  N *local_38;
  char *local_30;
  void *local_28;
  NS *local_20;
  N *local_18;
  NS *local_10;
  
  data = (NS *)operator_new(0x18);
  memset(data,0,0x18);
  NS::NS((NS *)0x1a5472);
  local_10 = data;
  this = (N *)operator_new(0x18);
  memset(this,0,0x18);
  NS::NS((NS *)0x1a54a6);
  local_18 = this;
  graph = (NS *)operator_new(0x18);
  memset(graph,0,0x18);
  NS::NS((NS *)0x1a54db);
  local_20 = graph;
  pvVar1 = operator_new(0x18);
  memset(pvVar1,0,0x18);
  NS::NS((NS *)0x1a5510);
  local_28 = pvVar1;
  data_00 = (char *)operator_new(0x18);
  memset(data_00,0,0x18);
  NS::NS((NS *)0x1a5545);
  local_30 = data_00;
  this_00 = (N *)N::operator_new((size_t)pvVar1,graph);
  N::N<NS*>(this,data);
  local_38 = this_00;
  pNVar2 = (N *)N::operator_new((size_t)pvVar1,graph);
  N::N<NS*>(this,data);
  local_40 = pNVar2;
  pNVar2 = (N *)N::operator_new((size_t)pvVar1,graph);
  N::N<NS*>(this,data);
  local_48 = pNVar2;
  pNVar2 = (N *)N::operator_new((size_t)pvVar1,graph);
  N::N<NS*>(this,data);
  local_50 = pNVar2;
  pvVar3 = N::operator_new((size_t)pvVar1,graph);
  N::N<int>(this,(int)((ulong)data >> 0x20));
  local_58 = pvVar3;
  pvVar3 = N::operator_new((size_t)pvVar1,graph);
  N::N<int>(this,(int)((ulong)data >> 0x20));
  local_60 = pvVar3;
  pvVar3 = N::operator_new((size_t)pvVar1,graph);
  N::N<char_const*>(this_00,data_00);
  local_68 = pvVar3;
  pvVar1 = N::operator_new((size_t)pvVar1,graph);
  N::N<char_const*>(this_00,data_00);
  local_88 = local_40;
  local_80 = (sockaddr *)&local_88;
  local_78 = 1;
  local_70 = pvVar1;
  N::connect(local_38,(int)local_68,local_80,1);
  local_a0 = local_38;
  local_98 = (sockaddr *)&local_a0;
  local_90 = 1;
  N::connect(local_40,(int)local_68,local_98,1);
  local_b8 = local_50;
  local_b0 = (sockaddr *)&local_b8;
  local_a8 = 1;
  N::connect(local_48,(int)local_68,local_b0,1);
  local_d0 = local_48;
  local_c8 = (sockaddr *)&local_d0;
  local_c0 = 1;
  N::connect(local_50,(int)local_68,local_c8,1);
  local_e8 = local_48;
  local_e0 = (sockaddr *)&local_e8;
  local_d8 = 1;
  N::connect(local_38,(int)local_70,local_e0,1);
  local_100 = local_50;
  local_f8 = (sockaddr *)&local_100;
  local_f0 = 1;
  N::connect(local_40,(int)local_70,local_f8,1);
  std::tuple<NS_*>::tuple<NS_*&,_true,_true>((tuple<NS_*> *)this,(NS **)data);
  return (tuple<NS_*>)in_RDI.super__Head_base<0UL,_NS_*,_false>._M_head_impl;
}

Assistant:

std::tuple<NS*> double_nested() {
        auto g0 = new NS(), g1a = new NS(), g1b = new NS(), g2a = new NS(), g2b = new NS();
        auto a = new(g0) N(g1a), b = new(g0) N(g1b);
        auto x = new(g1a) N(g2a), y = new(g1b) N(g2b);
        auto xm = new(g2a) N(0), ym = new(g2b) N(1);

        auto s = new(g0) N("sib"), c = new(g0) N("child");

        a->connect(s, {b}); b->connect(s, {a});
        x->connect(s, {y}); y->connect(s, {x});

        a->connect(c, {x}); b->connect(c, {y});


        return {g0,};
    }